

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

int __thiscall
ApprovalTests::Options::FileOptions::clone
          (FileOptions *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *local_38;
  size_type local_30;
  size_type local_28;
  undefined8 uStack_20;
  
  local_38 = &local_28;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,*(long *)(__fn + 8),*(long *)(__fn + 0x10) + *(long *)(__fn + 8),
             ___flags);
  this->options_ = (Options *)0x0;
  paVar1 = &(this->fileExtensionWithDot_).field_2;
  (this->fileExtensionWithDot_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = local_28;
    *(undefined8 *)((long)&(this->fileExtensionWithDot_).field_2 + 8) = uStack_20;
  }
  else {
    (this->fileExtensionWithDot_)._M_dataplus._M_p = (pointer)local_38;
    (this->fileExtensionWithDot_).field_2._M_allocated_capacity = local_28;
  }
  (this->fileExtensionWithDot_)._M_string_length = local_30;
  return (int)this;
}

Assistant:

Options::FileOptions Options::FileOptions::clone() const
    {
        // the returned options_ must be null
        return FileOptions(fileExtensionWithDot_);
    }